

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool __thiscall
libcellml::Units::UnitsImpl::performTestWithHistory
          (UnitsImpl *this,History *history,UnitsConstPtr *units,TestType type)

{
  UnitsImpl *pUVar1;
  EntityImpl *pEVar2;
  undefined8 name;
  bool bVar3;
  string *psVar4;
  size_t index;
  Units *this_00;
  bool bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string *psVar7;
  string reference;
  UnitsPtr childUnits;
  UnitsPtr importedUnits;
  HistoryEpochPtr h;
  undefined1 local_c8 [32];
  History *local_a8;
  string local_a0;
  string local_80;
  undefined1 local_60 [16];
  HistoryEpochPtr local_50;
  ImportSource *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_a8 = history;
  bVar3 = ImportedEntity::isImport(&this->mUnits->super_ImportedEntity);
  if (bVar3) {
    ImportedEntity::importSource(&this->mUnits->super_ImportedEntity);
    ImportSource::model((ImportSource *)local_c8);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
    name = local_c8._0_8_;
    local_c8._0_8_ = (string *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    }
    if ((string *)name == (string *)0x0) {
      bVar3 = false;
    }
    else {
      ImportedEntity::importReference_abi_cxx11_
                ((string *)local_c8,&this->mUnits->super_ImportedEntity);
      Model::units((Model *)local_60,(string *)name);
      if ((string *)local_c8._0_8_ != (string *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if ((string *)local_60._0_8_ == (string *)0x0) {
        bVar3 = false;
      }
      else {
        ImportedEntity::importSource(&this->mUnits->super_ImportedEntity);
        ImportSource::url_abi_cxx11_(&local_a0,local_40);
        importeeModelUrl((string *)local_c8,local_a8,&local_a0);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
        createHistoryEpoch((libcellml *)&local_50,units,(string *)local_c8,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_c8._0_8_ != (string *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&local_a0 + 0x10U)) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        bVar3 = checkForImportCycles(local_a8,&local_50);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          std::
          vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
          ::push_back(local_a8,&local_50);
          pUVar1 = *(UnitsImpl **)(local_60._0_8_ + 8);
          local_c8._0_8_ = local_60._0_8_;
          local_c8._8_8_ = local_60._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_60._8_8_ + 8) = *(_Atomic_word *)(local_60._8_8_ + 8) + 1;
            }
          }
          bVar3 = performTestWithHistory(pUVar1,local_a8,(UnitsConstPtr *)local_c8,type);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
          }
        }
        if (local_50.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.
                     super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
    }
  }
  else {
    ParentedEntity::parent((ParentedEntity *)local_c8);
    if ((string *)local_c8._0_8_ == (string *)0x0) {
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      psVar7 = (string *)0x0;
    }
    else {
      psVar4 = (string *)__dynamic_cast(local_c8._0_8_,&ParentedEntity::typeinfo,&Model::typeinfo,0)
      ;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      psVar7 = (string *)0x0;
      if (psVar4 != (string *)0x0) {
        psVar7 = psVar4;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_c8._8_8_ + 8) = *(_Atomic_word *)(local_c8._8_8_ + 8) + 1;
          }
        }
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    this_00 = this->mUnits;
    pEVar2 = (this_00->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    bVar3 = true;
    if (*(size_type *)((long)&pEVar2[2].mId.field_2 + 8) !=
        pEVar2[2].mId.field_2._M_allocated_capacity) {
      index = 0;
      do {
        unitAttributeReference_abi_cxx11_((string *)local_c8,this_00,index);
        bVar3 = isStandardUnitName((string *)local_c8);
        bVar5 = false;
        if (!bVar3) {
          if (psVar7 == (string *)0x0) {
            bVar5 = true;
            if (type != DEFINED) {
LAB_00253ced:
              bVar5 = false;
            }
          }
          else {
            Model::units((Model *)&local_a0,psVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              if (type != DEFINED) goto LAB_00253cde;
            }
            else {
              pUVar1 = *(UnitsImpl **)(local_a0._M_dataplus._M_p + 8);
              local_80._M_dataplus._M_p = local_a0._M_dataplus._M_p;
              local_80._M_string_length = local_a0._M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_a0._M_string_length + 8) =
                       *(_Atomic_word *)(local_a0._M_string_length + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_a0._M_string_length + 8) =
                       *(_Atomic_word *)(local_a0._M_string_length + 8) + 1;
                }
              }
              bVar3 = performTestWithHistory(pUVar1,local_a8,(UnitsConstPtr *)&local_80,type);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length
                          );
              }
              if (bVar3) {
LAB_00253cde:
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_a0._M_string_length);
                }
                goto LAB_00253ced;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
            }
            bVar5 = true;
          }
        }
        if ((string *)local_c8._0_8_ != (string *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
        if (bVar5) {
          bVar3 = false;
          goto LAB_00253ddf;
        }
        this_00 = this->mUnits;
        pEVar2 = (this_00->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
        index = index + 1;
      } while (index < (ulong)(((long)(*(long *)((long)&pEVar2[2].mId.field_2 + 8) -
                                      pEVar2[2].mId.field_2._M_allocated_capacity) >> 4) *
                              0x6db6db6db6db6db7));
      bVar3 = true;
    }
  }
LAB_00253ddf:
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  return bVar3;
}

Assistant:

bool Units::UnitsImpl::performTestWithHistory(History &history, const UnitsConstPtr &units, TestType type) const
{
    ModelPtr model;
    if (mUnits->isImport()) {
        model = mUnits->importSource()->model();
        if (model == nullptr) {
            return false;
        }

        auto importedUnits = model->units(mUnits->importReference());
        if (importedUnits == nullptr) {
            return false;
        }

        auto h = createHistoryEpoch(units, importeeModelUrl(history, mUnits->importSource()->url()));
        if (checkForImportCycles(history, h)) {
            return false;
        }

        history.push_back(h);

        return importedUnits->pFunc()->performTestWithHistory(history, importedUnits, type);
    }

    model = std::dynamic_pointer_cast<libcellml::Model>(mUnits->parent());
    for (size_t unitIndex = 0; unitIndex < mUnits->unitCount(); ++unitIndex) {
        std::string reference = mUnits->unitAttributeReference(unitIndex);
        if (isStandardUnitName(reference)) {
            continue;
        }

        if (model != nullptr) {
            auto childUnits = model->units(reference);
            if (childUnits != nullptr) {
                if (!childUnits->pFunc()->performTestWithHistory(history, childUnits, type)) {
                    return false;
                }
            } else if (type == TestType::DEFINED) {
                return false;
            }
        } else if (type == TestType::DEFINED) {
            return false;
        }
    }

    return true;
}